

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t1.c
# Opt level: O1

void opj_t1_dec_sigpass_mqc(opj_t1_t *t1,OPJ_INT32 bpno,OPJ_INT32 cblksty)

{
  OPJ_UINT32 *pOVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  opj_mqc_state_t *poVar5;
  OPJ_BYTE *pOVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  OPJ_UINT32 c;
  uint uVar10;
  opj_mqc_state_t **ppoVar11;
  uint uVar12;
  OPJ_UINT32 i;
  int iVar13;
  uint uVar14;
  ulong uVar15;
  uint uVar16;
  ulong uVar17;
  OPJ_UINT32 OVar18;
  uint uVar19;
  OPJ_UINT32 OVar20;
  uint *puVar21;
  uint *puVar22;
  uint *puVar23;
  uint *puVar24;
  opj_flag_t *flagsp;
  uint uVar25;
  ulong uVar26;
  bool bVar27;
  
  uVar10 = t1->w;
  uVar15 = (ulong)uVar10;
  if ((uVar15 == 0x40) && (t1->h == 0x40)) {
    puVar21 = t1->flags + 0x43;
    uVar7 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    uVar8 = -uVar7;
    puVar24 = (uint *)t1->data;
    ppoVar11 = (t1->mqc).curctx;
    uVar10 = (t1->mqc).c;
    uVar16 = (t1->mqc).a;
    OVar18 = (t1->mqc).ct;
    uVar14 = 0;
    if ((cblksty & 8U) == 0) {
      do {
        iVar13 = 0;
        do {
          puVar23 = puVar24;
          puVar22 = puVar21;
          uVar12 = *puVar22;
          uVar15 = (ulong)uVar12;
          if (uVar15 != 0) {
            if ((uVar12 & 0x1ef) != 0 && (uVar12 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar15 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar25 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar25 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_001288d3;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_001288d3:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar25 = poVar5->mps;
                }
                else {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_00128963;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00128963:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar25 != 0) {
                uVar19 = uVar12 >> 0x10 & 0x40 | uVar12 & 0xaa | uVar12 >> 0xe & 0x10 |
                         puVar22[-1] >> 0x13 & 1 | puVar22[1] >> 0x11 & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_00128a5f;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00128a5f:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_00128aef;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00128aef:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar9 = uVar25 ^ bVar3;
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                *puVar23 = uVar19;
                *(byte *)(puVar22 + -1) = (byte)puVar22[-1] | 0x20;
                uVar12 = uVar9 << 0x13 | uVar12 | 0x10;
                *(byte *)(puVar22 + 1) = (byte)puVar22[1] | 8;
                puVar22[-0x42] = uVar9 << 0x1f | puVar22[-0x42] | 0x10000;
                *(byte *)((long)puVar22 + -0x10a) = *(byte *)((long)puVar22 + -0x10a) | 2;
                *(byte *)((long)puVar22 + -0x103) = *(byte *)((long)puVar22 + -0x103) | 0x80;
              }
              uVar15 = (ulong)(uVar12 | 0x200000);
            }
            uVar12 = (uint)uVar15;
            if ((uVar15 & 0xf78) != 0 && (uVar15 & 0x1000080) == 0) {
              uVar25 = (uint)(uVar15 >> 3);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar9 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar9 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_00128c23;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00128c23:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar9 = poVar5->mps;
                }
                else {
                  uVar9 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar9 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_00128cb3;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00128cb3:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar9 != 0) {
                uVar19 = (uint)(uVar15 >> 0x13) & 0x40 | uVar25 & 0xaa |
                         (uint)(uVar15 >> 0xf) & 0x10 | puVar22[-1] >> 0x16 & 1 |
                         puVar22[1] >> 0x14 & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_00128dac;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00128dac:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_00128e3c;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00128e3c:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                puVar23[0x40] = uVar19;
                *(byte *)((long)puVar22 + -3) = *(byte *)((long)puVar22 + -3) | 1;
                uVar12 = uVar12 | (uVar25 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar22 + 1) = (byte)puVar22[1] | 0x40;
              }
              uVar15 = (ulong)(uVar12 | 0x1000000);
            }
            uVar12 = (uint)uVar15;
            if ((uVar15 & 0x7bc0) != 0 && (uVar15 & 0x8000400) == 0) {
              uVar25 = (uint)(uVar15 >> 6);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar9 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar9 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_00128f4d;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00128f4d:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar9 = poVar5->mps;
                }
                else {
                  uVar9 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar9 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_00128fdd;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00128fdd:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar9 != 0) {
                uVar19 = (uint)(uVar15 >> 0x16) & 0x40 | uVar25 & 0xaa |
                         (uint)(uVar15 >> 0x12) & 0x10 | puVar22[-1] >> 0x19 & 1 |
                         puVar22[1] >> 0x17 & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_001290d6;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001290d6:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_00129166;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00129166:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                puVar23[0x80] = uVar19;
                *(byte *)((long)puVar22 + -3) = *(byte *)((long)puVar22 + -3) | 8;
                uVar12 = uVar12 | (uVar25 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar22 + 5) = *(byte *)((long)puVar22 + 5) | 2;
              }
              uVar15 = (ulong)(uVar12 | 0x8000000);
            }
            uVar12 = (uint)uVar15;
            if ((uVar15 & 0x3de00) != 0 && (uVar15 & 0x40002000) == 0) {
              uVar25 = (uint)(uVar15 >> 9);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar9 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar9 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_00129277;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00129277:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar9 = poVar5->mps;
                }
                else {
                  uVar9 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar9 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_00129307;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00129307:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar9 != 0) {
                uVar19 = (uint)(uVar15 >> 0x19) & 0x40 | uVar25 & 0xaa |
                         (uint)(uVar15 >> 0x15) & 0x10 | puVar22[-1] >> 0x1c & 1 |
                         puVar22[1] >> 0x1a & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_00129400;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00129400:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_00129490;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00129490:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar9 = uVar25 ^ bVar3;
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                puVar23[0xc0] = uVar19;
                *(byte *)((long)puVar22 + -3) = *(byte *)((long)puVar22 + -3) | 0x40;
                *(byte *)((long)puVar22 + 5) = *(byte *)((long)puVar22 + 5) | 0x10;
                puVar22[0x42] = uVar9 << 0x12 | puVar22[0x42] | 2;
                *(byte *)(puVar22 + 0x41) = (byte)puVar22[0x41] | 4;
                uVar12 = uVar12 | uVar9 << 0x1c | 0x2000;
                *(byte *)(puVar22 + 0x43) = (byte)puVar22[0x43] | 1;
              }
              uVar12 = uVar12 | 0x40000000;
            }
            *puVar22 = uVar12;
          }
          iVar13 = iVar13 + 1;
          puVar21 = puVar22 + 1;
          puVar24 = puVar23 + 1;
        } while (iVar13 != 0x40);
        puVar24 = puVar23 + 0xc1;
        puVar21 = puVar22 + 3;
        bVar27 = uVar14 < 0x3c;
        uVar14 = uVar14 + 4;
      } while (bVar27);
    }
    else {
      do {
        iVar13 = 0;
        do {
          puVar23 = puVar24;
          puVar22 = puVar21;
          uVar12 = *puVar22;
          uVar15 = (ulong)uVar12;
          if (uVar15 != 0) {
            if ((uVar12 & 0x1ef) != 0 && (uVar12 & 0x200010) == 0) {
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar15 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar25 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar25 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_00129616;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00129616:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar25 = poVar5->mps;
                }
                else {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_001296a7;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001296a7:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar25 != 0) {
                uVar19 = uVar12 >> 0x10 & 0x40 | uVar12 & 0xaa | uVar12 >> 0xe & 0x10 |
                         puVar22[-1] >> 0x13 & 1 | puVar22[1] >> 0x11 & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_001297a5;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001297a5:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_00129835;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00129835:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                *puVar23 = uVar19;
                *(byte *)(puVar22 + -1) = (byte)puVar22[-1] | 0x20;
                uVar12 = (uVar25 ^ bVar3) << 0x13 | uVar12 | 0x10;
                *(byte *)(puVar22 + 1) = (byte)puVar22[1] | 8;
              }
              uVar15 = (ulong)(uVar12 | 0x200000);
            }
            uVar12 = (uint)uVar15;
            if ((uVar15 & 0xf78) != 0 && (uVar15 & 0x1000080) == 0) {
              uVar25 = (uint)(uVar15 >> 3);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar9 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar9 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_00129941;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00129941:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar9 = poVar5->mps;
                }
                else {
                  uVar9 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar9 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_001299d1;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_001299d1:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar9 != 0) {
                uVar19 = (uint)(uVar15 >> 0x13) & 0x40 | uVar25 & 0xaa |
                         (uint)(uVar15 >> 0xf) & 0x10 | puVar22[-1] >> 0x16 & 1 |
                         puVar22[1] >> 0x14 & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_00129aca;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00129aca:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_00129b5a;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00129b5a:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                puVar23[0x40] = uVar19;
                *(byte *)((long)puVar22 + -3) = *(byte *)((long)puVar22 + -3) | 1;
                uVar12 = uVar12 | (uVar25 ^ bVar3) << 0x16 | 0x80;
                *(byte *)(puVar22 + 1) = (byte)puVar22[1] | 0x40;
              }
              uVar15 = (ulong)(uVar12 | 0x1000000);
            }
            uVar12 = (uint)uVar15;
            if ((uVar15 & 0x7bc0) != 0 && (uVar15 & 0x8000400) == 0) {
              uVar25 = (uint)(uVar15 >> 6);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar9 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar9 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_00129c6b;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00129c6b:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar9 = poVar5->mps;
                }
                else {
                  uVar9 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar9 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_00129cfb;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00129cfb:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar9 != 0) {
                uVar19 = (uint)(uVar15 >> 0x16) & 0x40 | uVar25 & 0xaa |
                         (uint)(uVar15 >> 0x12) & 0x10 | puVar22[-1] >> 0x19 & 1 |
                         puVar22[1] >> 0x17 & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_00129df4;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_00129df4:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_00129e84;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_00129e84:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                puVar23[0x80] = uVar19;
                *(byte *)((long)puVar22 + -3) = *(byte *)((long)puVar22 + -3) | 8;
                uVar12 = uVar12 | (uVar25 ^ bVar3) << 0x19 | 0x400;
                *(byte *)((long)puVar22 + 5) = *(byte *)((long)puVar22 + 5) | 2;
              }
              uVar15 = (ulong)(uVar12 | 0x8000000);
            }
            uVar12 = (uint)uVar15;
            if ((uVar15 & 0x3de00) != 0 && (uVar15 & 0x40002000) == 0) {
              uVar25 = (uint)(uVar15 >> 9);
              bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar25 & 0x1ef];
              ppoVar11 = (t1->mqc).ctxs + bVar3;
              poVar5 = (t1->mqc).ctxs[bVar3];
              uVar19 = poVar5->qeval;
              uVar16 = uVar16 - uVar19;
              if (uVar10 >> 0x10 < uVar19) {
                uVar9 = (uint)(poVar5->mps == 0);
                if (uVar19 > uVar16) {
                  uVar9 = poVar5->mps;
                }
                *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                uVar16 = uVar19;
                do {
                  if (OVar18 == 0) {
                    pOVar6 = (t1->mqc).bp;
                    bVar3 = pOVar6[1];
                    if (*pOVar6 == 0xff) {
                      if (bVar3 < 0x90) {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x200;
                        OVar18 = 7;
                        goto LAB_00129f95;
                      }
                      uVar10 = uVar10 + 0xff00;
                      pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                      *pOVar1 = *pOVar1 + 1;
                    }
                    else {
                      (t1->mqc).bp = pOVar6 + 1;
                      uVar10 = uVar10 + (uint)bVar3 * 0x100;
                    }
                    OVar18 = 8;
                  }
LAB_00129f95:
                  uVar16 = uVar16 * 2;
                  uVar10 = uVar10 * 2;
                  OVar18 = OVar18 - 1;
                } while (uVar16 < 0x8000);
              }
              else {
                uVar10 = uVar10 + uVar19 * -0x10000;
                if ((short)uVar16 < 0) {
                  uVar9 = poVar5->mps;
                }
                else {
                  uVar9 = (uint)(poVar5->mps == 0);
                  if (uVar16 >= uVar19) {
                    uVar9 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar3 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar3 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar3 * 0x200;
                          OVar18 = 7;
                          goto LAB_0012a025;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar3 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0012a025:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
              }
              if (uVar9 != 0) {
                uVar19 = (uint)(uVar15 >> 0x19) & 0x40 | uVar25 & 0xaa |
                         (uint)(uVar15 >> 0x15) & 0x10 | puVar22[-1] >> 0x1c & 1 |
                         puVar22[1] >> 0x1a & 4;
                bVar3 = ""[uVar19];
                ppoVar11 = (t1->mqc).ctxs +
                           "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                           [uVar19];
                poVar5 = *ppoVar11;
                uVar19 = poVar5->qeval;
                uVar16 = uVar16 - uVar19;
                if (uVar10 >> 0x10 < uVar19) {
                  uVar25 = (uint)(poVar5->mps == 0);
                  if (uVar19 > uVar16) {
                    uVar25 = poVar5->mps;
                  }
                  *ppoVar11 = (&poVar5->nmps)[uVar19 <= uVar16];
                  uVar16 = uVar19;
                  do {
                    if (OVar18 == 0) {
                      pOVar6 = (t1->mqc).bp;
                      bVar4 = pOVar6[1];
                      if (*pOVar6 == 0xff) {
                        if (bVar4 < 0x90) {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x200;
                          OVar18 = 7;
                          goto LAB_0012a11e;
                        }
                        uVar10 = uVar10 + 0xff00;
                        pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                        *pOVar1 = *pOVar1 + 1;
                      }
                      else {
                        (t1->mqc).bp = pOVar6 + 1;
                        uVar10 = uVar10 + (uint)bVar4 * 0x100;
                      }
                      OVar18 = 8;
                    }
LAB_0012a11e:
                    uVar16 = uVar16 * 2;
                    uVar10 = uVar10 * 2;
                    OVar18 = OVar18 - 1;
                  } while (uVar16 < 0x8000);
                }
                else {
                  uVar10 = uVar10 + uVar19 * -0x10000;
                  if ((short)uVar16 < 0) {
                    uVar25 = poVar5->mps;
                  }
                  else {
                    uVar25 = (uint)(poVar5->mps == 0);
                    if (uVar16 >= uVar19) {
                      uVar25 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar16 < uVar19];
                    do {
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar4 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar4 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            uVar10 = uVar10 + (uint)bVar4 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012a1ae;
                          }
                          uVar10 = uVar10 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          uVar10 = uVar10 + (uint)bVar4 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012a1ae:
                      uVar16 = uVar16 * 2;
                      uVar10 = uVar10 * 2;
                      OVar18 = OVar18 - 1;
                    } while (uVar16 < 0x8000);
                  }
                }
                uVar9 = uVar25 ^ bVar3;
                uVar19 = uVar8;
                if (uVar25 == bVar3) {
                  uVar19 = uVar7;
                }
                puVar23[0xc0] = uVar19;
                *(byte *)((long)puVar22 + -3) = *(byte *)((long)puVar22 + -3) | 0x40;
                *(byte *)((long)puVar22 + 5) = *(byte *)((long)puVar22 + 5) | 0x10;
                puVar22[0x42] = uVar9 << 0x12 | puVar22[0x42] | 2;
                *(byte *)(puVar22 + 0x41) = (byte)puVar22[0x41] | 4;
                uVar12 = uVar12 | uVar9 << 0x1c | 0x2000;
                *(byte *)(puVar22 + 0x43) = (byte)puVar22[0x43] | 1;
              }
              uVar12 = uVar12 | 0x40000000;
            }
            *puVar22 = uVar12;
          }
          iVar13 = iVar13 + 1;
          puVar21 = puVar22 + 1;
          puVar24 = puVar23 + 1;
        } while (iVar13 != 0x40);
        puVar24 = puVar23 + 0xc1;
        puVar21 = puVar22 + 3;
        bVar27 = uVar14 < 0x3c;
        uVar14 = uVar14 + 4;
      } while (bVar27);
    }
    (t1->mqc).curctx = ppoVar11;
    (t1->mqc).c = uVar10;
    (t1->mqc).a = uVar16;
    (t1->mqc).ct = OVar18;
  }
  else {
    flagsp = t1->flags + (uVar10 + 3);
    uVar8 = (uint)(1 << ((byte)bpno & 0x1f)) >> 1 | 1 << (bpno & 0x1fU);
    puVar24 = (uint *)t1->data;
    ppoVar11 = (t1->mqc).curctx;
    uVar16 = (t1->mqc).c;
    uVar26 = (ulong)uVar16;
    uVar14 = (t1->mqc).a;
    OVar18 = (t1->mqc).ct;
    uVar7 = t1->h;
    if ((cblksty & 8U) == 0) {
      uVar12 = 0;
      if (3 < uVar7) {
        uVar19 = -uVar8;
        uVar12 = 0;
        do {
          if (uVar15 != 0) {
            uVar16 = 0;
            do {
              uVar7 = *flagsp;
              uVar17 = (ulong)uVar7;
              if (uVar17 != 0) {
                if ((uVar7 & 0x1ef) != 0 && (uVar7 & 0x200010) == 0) {
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012a3df;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012a3df:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012a469;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012a469:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = uVar7 >> 0x10 & 0x40 | uVar7 & 0xaa | uVar7 >> 0xe & 0x10 |
                             flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012a566;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012a566:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012a5ed;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012a5ed:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar9 = OVar20 ^ bVar3;
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    *puVar24 = uVar25;
                    *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                    uVar7 = uVar9 << 0x13 | uVar7 | 0x10;
                    uVar17 = (ulong)(t1->w + 2);
                    puVar21 = flagsp + -uVar17;
                    *puVar21 = uVar9 << 0x1f | *puVar21 | 0x10000;
                    pbVar2 = (byte *)((long)flagsp + uVar17 * -4 + -2);
                    *pbVar2 = *pbVar2 | 2;
                    *(byte *)((long)puVar21 + 5) = *(byte *)((long)puVar21 + 5) | 0x80;
                  }
                  uVar17 = (ulong)(uVar7 | 0x200000);
                }
                uVar7 = (uint)uVar17;
                if ((uVar17 & 0xf78) != 0 && (uVar17 & 0x1000080) == 0) {
                  uVar9 = (uint)(uVar17 >> 3);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar9 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012a72b;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012a72b:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012a7b2;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012a7b2:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = (uint)(uVar17 >> 0x13) & 0x40 | uVar9 & 0xaa |
                             (uint)(uVar17 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                             flagsp[1] >> 0x14 & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012a8a8;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012a8a8:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012a92f;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012a92f:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    puVar24[uVar15] = uVar25;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                    uVar7 = uVar7 | (OVar20 ^ bVar3) << 0x16 | 0x80;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
                  }
                  uVar17 = (ulong)(uVar7 | 0x1000000);
                }
                uVar7 = (uint)uVar17;
                if ((uVar17 & 0x7bc0) != 0 && (uVar17 & 0x8000400) == 0) {
                  uVar9 = (uint)(uVar17 >> 6);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar9 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012aa40;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012aa40:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012aac7;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012aac7:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = (uint)(uVar17 >> 0x16) & 0x40 | uVar9 & 0xaa |
                             (uint)(uVar17 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                             flagsp[1] >> 0x17 & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012abbd;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012abbd:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012ac44;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012ac44:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    puVar24[uVar10 * 2] = uVar25;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                    uVar7 = uVar7 | (OVar20 ^ bVar3) << 0x19 | 0x400;
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
                  }
                  uVar17 = (ulong)(uVar7 | 0x8000000);
                }
                uVar7 = (uint)uVar17;
                if ((uVar17 & 0x3de00) != 0 && (uVar17 & 0x40002000) == 0) {
                  uVar9 = (uint)(uVar17 >> 9);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar9 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012ad55;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012ad55:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012addc;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012addc:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = (uint)(uVar17 >> 0x19) & 0x40 | uVar9 & 0xaa |
                             (uint)(uVar17 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                             flagsp[1] >> 0x1a & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012aed2;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012aed2:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012af59;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012af59:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar9 = OVar20 ^ bVar3;
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    puVar24[uVar10 * 3] = uVar25;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                    uVar17 = (ulong)(t1->w + 2);
                    flagsp[uVar17] = uVar9 << 0x12 | flagsp[uVar17] | 2;
                    *(byte *)(flagsp + (uVar17 - 1)) = (byte)flagsp[uVar17 - 1] | 4;
                    uVar7 = uVar7 | uVar9 << 0x1c | 0x2000;
                    *(byte *)(flagsp + uVar17 + 1) = (byte)flagsp[uVar17 + 1] | 1;
                  }
                  uVar7 = uVar7 | 0x40000000;
                }
                *flagsp = uVar7;
              }
              uVar16 = uVar16 + 1;
              puVar24 = puVar24 + 1;
              flagsp = flagsp + 1;
            } while (uVar16 != uVar10);
          }
          uVar16 = (uint)uVar26;
          uVar12 = uVar12 + 4;
          puVar24 = puVar24 + uVar10 * 3;
          flagsp = flagsp + 2;
          uVar7 = t1->h;
        } while (uVar12 < (uVar7 & 0xfffffffc));
      }
      (t1->mqc).curctx = ppoVar11;
      (t1->mqc).c = uVar16;
      (t1->mqc).a = uVar14;
      (t1->mqc).ct = OVar18;
      if (uVar15 != 0 && uVar12 < uVar7) {
        uVar16 = 0;
        do {
          if (t1->h != uVar12) {
            uVar15 = 0;
            uVar26 = 0;
            do {
              opj_t1_dec_sigpass_step_mqc
                        (t1,flagsp,(OPJ_INT32 *)(puVar24 + uVar15),uVar8,(OPJ_UINT32)uVar26,
                         t1->w + 2,0);
              uVar26 = uVar26 + 1;
              uVar15 = (ulong)((int)uVar15 + uVar10);
            } while (uVar26 < t1->h - uVar12);
          }
          uVar16 = uVar16 + 1;
          puVar24 = puVar24 + 1;
          flagsp = flagsp + 1;
        } while (uVar16 != uVar10);
      }
    }
    else {
      uVar12 = 0;
      if (3 < uVar7) {
        uVar19 = -uVar8;
        uVar12 = 0;
        do {
          if (uVar15 != 0) {
            uVar16 = 0;
            do {
              uVar7 = *flagsp;
              uVar17 = (ulong)uVar7;
              if (uVar17 != 0) {
                if ((uVar7 & 0x1ef) != 0 && (uVar7 & 0x200010) == 0) {
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar17 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012b1d8;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012b1d8:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012b265;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012b265:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = uVar7 >> 0x10 & 0x40 | uVar7 & 0xaa | uVar7 >> 0xe & 0x10 |
                             flagsp[-1] >> 0x13 & 1 | flagsp[1] >> 0x11 & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012b360;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012b360:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012b3e4;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012b3e4:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    *puVar24 = uVar25;
                    *(byte *)(flagsp + -1) = (byte)flagsp[-1] | 0x20;
                    uVar7 = (OVar20 ^ bVar3) << 0x13 | uVar7 | 0x10;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 8;
                  }
                  uVar17 = (ulong)(uVar7 | 0x200000);
                }
                uVar7 = (uint)uVar17;
                if ((uVar17 & 0xf78) != 0 && (uVar17 & 0x1000080) == 0) {
                  uVar9 = (uint)(uVar17 >> 3);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar9 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012b4eb;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012b4eb:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012b56f;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012b56f:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = (uint)(uVar17 >> 0x13) & 0x40 | uVar9 & 0xaa |
                             (uint)(uVar17 >> 0xf) & 0x10 | flagsp[-1] >> 0x16 & 1 |
                             flagsp[1] >> 0x14 & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012b662;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012b662:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012b6e6;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012b6e6:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    puVar24[uVar15] = uVar25;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 1;
                    uVar7 = uVar7 | (OVar20 ^ bVar3) << 0x16 | 0x80;
                    *(byte *)(flagsp + 1) = (byte)flagsp[1] | 0x40;
                  }
                  uVar17 = (ulong)(uVar7 | 0x1000000);
                }
                uVar7 = (uint)uVar17;
                if ((uVar17 & 0x7bc0) != 0 && (uVar17 & 0x8000400) == 0) {
                  uVar9 = (uint)(uVar17 >> 6);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar9 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012b7f4;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012b7f4:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012b878;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012b878:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = (uint)(uVar17 >> 0x16) & 0x40 | uVar9 & 0xaa |
                             (uint)(uVar17 >> 0x12) & 0x10 | flagsp[-1] >> 0x19 & 1 |
                             flagsp[1] >> 0x17 & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012b96b;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012b96b:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012b9ef;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012b9ef:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    puVar24[uVar10 * 2] = uVar25;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 8;
                    uVar7 = uVar7 | (OVar20 ^ bVar3) << 0x19 | 0x400;
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 2;
                  }
                  uVar17 = (ulong)(uVar7 | 0x8000000);
                }
                uVar7 = (uint)uVar17;
                if ((uVar17 & 0x3de00) != 0 && (uVar17 & 0x40002000) == 0) {
                  uVar9 = (uint)(uVar17 >> 9);
                  bVar3 = (t1->mqc).lut_ctxno_zc_orient[uVar9 & 0x1ef];
                  ppoVar11 = (t1->mqc).ctxs + bVar3;
                  poVar5 = (t1->mqc).ctxs[bVar3];
                  uVar25 = poVar5->qeval;
                  uVar14 = uVar14 - uVar25;
                  if ((uint)(uVar26 >> 0x10) < uVar25) {
                    OVar20 = (uint)(poVar5->mps == 0);
                    if (uVar25 > uVar14) {
                      OVar20 = poVar5->mps;
                    }
                    *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                    uVar14 = uVar25;
                    do {
                      iVar13 = (int)uVar26;
                      if (OVar18 == 0) {
                        pOVar6 = (t1->mqc).bp;
                        bVar3 = pOVar6[1];
                        if (*pOVar6 == 0xff) {
                          if (bVar3 < 0x90) {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x200;
                            OVar18 = 7;
                            goto LAB_0012bafd;
                          }
                          iVar13 = iVar13 + 0xff00;
                          pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                          *pOVar1 = *pOVar1 + 1;
                        }
                        else {
                          (t1->mqc).bp = pOVar6 + 1;
                          iVar13 = iVar13 + (uint)bVar3 * 0x100;
                        }
                        OVar18 = 8;
                      }
LAB_0012bafd:
                      uVar14 = uVar14 * 2;
                      uVar26 = (ulong)(uint)(iVar13 * 2);
                      OVar18 = OVar18 - 1;
                    } while (uVar14 < 0x8000);
                  }
                  else {
                    uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                    if ((short)uVar14 < 0) {
                      OVar20 = poVar5->mps;
                    }
                    else {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar14 >= uVar25) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar3 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar3 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar3 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012bb81;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar3 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012bb81:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                  }
                  if (OVar20 != 0) {
                    uVar25 = (uint)(uVar17 >> 0x19) & 0x40 | uVar9 & 0xaa |
                             (uint)(uVar17 >> 0x15) & 0x10 | flagsp[-1] >> 0x1c & 1 |
                             flagsp[1] >> 0x1a & 4;
                    bVar3 = ""[uVar25];
                    ppoVar11 = (t1->mqc).ctxs +
                               "\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\t\t\n\n\t\t\n\n\f\f\r\v\f\f\r\v\t\t\n\n\t\t\n\n\f\f\v\r\f\f\v\r\f\f\r\r\f\f\v\v\f\t\r\n\t\f\n\v\f\f\v\v\f\f\r\r\f\t\v\n\t\f\n\r\n\n\n\n\n\n\n\n\r\v\r\v\r\v\r\v\n\n\t\t\n\n\t\t\r\v\f\f\r\v\f\f\r\r\r\r\v\v\v\v\r\n\r\n\n\v\n\v\r\r\f\f\v\v\f\f\r\n\f\t\n\v\t\f\n\n\t\t\n\n\t\t\v\r\f\f\v\r\f\f\n\n\n\n\n\n\n\n\v\r\v\r\v\r\v\r\v\v\f\f\r\r\f\f\v\n\f\t\n\r\t\f\v\v\v\v\r\r\r\r\v\n\v\n\n\r\n\r"
                               [uVar25];
                    poVar5 = *ppoVar11;
                    uVar25 = poVar5->qeval;
                    uVar14 = uVar14 - uVar25;
                    if ((uint)(uVar26 >> 0x10) < uVar25) {
                      OVar20 = (uint)(poVar5->mps == 0);
                      if (uVar25 > uVar14) {
                        OVar20 = poVar5->mps;
                      }
                      *ppoVar11 = (&poVar5->nmps)[uVar25 <= uVar14];
                      uVar14 = uVar25;
                      do {
                        iVar13 = (int)uVar26;
                        if (OVar18 == 0) {
                          pOVar6 = (t1->mqc).bp;
                          bVar4 = pOVar6[1];
                          if (*pOVar6 == 0xff) {
                            if (bVar4 < 0x90) {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x200;
                              OVar18 = 7;
                              goto LAB_0012bc74;
                            }
                            iVar13 = iVar13 + 0xff00;
                            pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                            *pOVar1 = *pOVar1 + 1;
                          }
                          else {
                            (t1->mqc).bp = pOVar6 + 1;
                            iVar13 = iVar13 + (uint)bVar4 * 0x100;
                          }
                          OVar18 = 8;
                        }
LAB_0012bc74:
                        uVar14 = uVar14 * 2;
                        uVar26 = (ulong)(uint)(iVar13 * 2);
                        OVar18 = OVar18 - 1;
                      } while (uVar14 < 0x8000);
                    }
                    else {
                      uVar26 = (ulong)((int)uVar26 + uVar25 * -0x10000);
                      if ((short)uVar14 < 0) {
                        OVar20 = poVar5->mps;
                      }
                      else {
                        OVar20 = (uint)(poVar5->mps == 0);
                        if (uVar14 >= uVar25) {
                          OVar20 = poVar5->mps;
                        }
                        *ppoVar11 = (&poVar5->nmps)[uVar14 < uVar25];
                        do {
                          iVar13 = (int)uVar26;
                          if (OVar18 == 0) {
                            pOVar6 = (t1->mqc).bp;
                            bVar4 = pOVar6[1];
                            if (*pOVar6 == 0xff) {
                              if (bVar4 < 0x90) {
                                (t1->mqc).bp = pOVar6 + 1;
                                iVar13 = iVar13 + (uint)bVar4 * 0x200;
                                OVar18 = 7;
                                goto LAB_0012bcf8;
                              }
                              iVar13 = iVar13 + 0xff00;
                              pOVar1 = &(t1->mqc).end_of_byte_stream_counter;
                              *pOVar1 = *pOVar1 + 1;
                            }
                            else {
                              (t1->mqc).bp = pOVar6 + 1;
                              iVar13 = iVar13 + (uint)bVar4 * 0x100;
                            }
                            OVar18 = 8;
                          }
LAB_0012bcf8:
                          uVar14 = uVar14 * 2;
                          uVar26 = (ulong)(uint)(iVar13 * 2);
                          OVar18 = OVar18 - 1;
                        } while (uVar14 < 0x8000);
                      }
                    }
                    uVar9 = OVar20 ^ bVar3;
                    uVar25 = uVar19;
                    if (OVar20 == bVar3) {
                      uVar25 = uVar8;
                    }
                    puVar24[uVar10 * 3] = uVar25;
                    *(byte *)((long)flagsp + -3) = *(byte *)((long)flagsp + -3) | 0x40;
                    *(byte *)((long)flagsp + 5) = *(byte *)((long)flagsp + 5) | 0x10;
                    uVar17 = (ulong)(t1->w + 2);
                    flagsp[uVar17] = uVar9 << 0x12 | flagsp[uVar17] | 2;
                    *(byte *)(flagsp + (uVar17 - 1)) = (byte)flagsp[uVar17 - 1] | 4;
                    uVar7 = uVar7 | uVar9 << 0x1c | 0x2000;
                    *(byte *)(flagsp + uVar17 + 1) = (byte)flagsp[uVar17 + 1] | 1;
                  }
                  uVar7 = uVar7 | 0x40000000;
                }
                *flagsp = uVar7;
              }
              uVar16 = uVar16 + 1;
              puVar24 = puVar24 + 1;
              flagsp = flagsp + 1;
            } while (uVar16 != uVar10);
          }
          uVar16 = (uint)uVar26;
          uVar12 = uVar12 + 4;
          puVar24 = puVar24 + uVar10 * 3;
          flagsp = flagsp + 2;
          uVar7 = t1->h;
        } while (uVar12 < (uVar7 & 0xfffffffc));
      }
      (t1->mqc).curctx = ppoVar11;
      (t1->mqc).c = uVar16;
      (t1->mqc).a = uVar14;
      (t1->mqc).ct = OVar18;
      if (uVar15 != 0 && uVar12 < uVar7) {
        uVar16 = 0;
        do {
          if (t1->h != uVar12) {
            uVar15 = 0;
            uVar26 = 0;
            do {
              opj_t1_dec_sigpass_step_mqc
                        (t1,flagsp,(OPJ_INT32 *)(puVar24 + uVar15),uVar8,(OPJ_UINT32)uVar26,
                         t1->w + 2,1);
              uVar26 = uVar26 + 1;
              uVar15 = (ulong)((int)uVar15 + uVar10);
            } while (uVar26 < t1->h - uVar12);
          }
          uVar16 = uVar16 + 1;
          puVar24 = puVar24 + 1;
          flagsp = flagsp + 1;
        } while (uVar16 != uVar10);
      }
    }
  }
  return;
}

Assistant:

static void opj_t1_dec_sigpass_mqc(
    opj_t1_t *t1,
    OPJ_INT32 bpno,
    OPJ_INT32 cblksty)
{
    if (t1->w == 64 && t1->h == 64) {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_sigpass_mqc_64x64_vsc(t1, bpno);
        } else {
            opj_t1_dec_sigpass_mqc_64x64_novsc(t1, bpno);
        }
    } else {
        if (cblksty & J2K_CCP_CBLKSTY_VSC) {
            opj_t1_dec_sigpass_mqc_generic_vsc(t1, bpno);
        } else {
            opj_t1_dec_sigpass_mqc_generic_novsc(t1, bpno);
        }
    }
}